

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_EncryptAes256CbcByteData_Test::TestBody(CryptoUtil_EncryptAes256CbcByteData_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_138;
  Message local_130;
  string local_128;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  ByteData byte_data;
  string local_d8;
  undefined1 local_b8 [8];
  ByteData data;
  string local_98;
  undefined1 local_78 [8];
  ByteData iv;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData key;
  CryptoUtil_EncryptAes256CbcByteData_Test *this_local;
  
  key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"616975656F616975656F616975656F616975656F616975656F616975656F6169",
             &local_49);
  cfd::core::ByteData::ByteData((ByteData *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,"33343536373839303132333435363738",
             (allocator *)
             ((long)&data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,"74657374207465737420746573742074657374",
             (allocator *)
             ((long)&byte_data.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&byte_data.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::CryptoUtil::EncryptAes256Cbc
            ((ByteData *)&gtest_ar.message_,(ByteData *)local_28,(ByteData *)local_78,
             (ByteData *)local_b8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_128,(ByteData *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_108,"byte_data.GetHex().c_str()",
             "\"2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22\"",pcVar2,
             "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22");
  std::__cxx11::string::~string((string *)&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0xc1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  cfd::core::ByteData::~ByteData((ByteData *)local_b8);
  cfd::core::ByteData::~ByteData((ByteData *)local_78);
  cfd::core::ByteData::~ByteData((ByteData *)local_28);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256CbcByteData) {
  ByteData key(
      "616975656F616975656F616975656F616975656F616975656F616975656F6169");
  ByteData iv("33343536373839303132333435363738");
  ByteData data("74657374207465737420746573742074657374");
  ByteData byte_data = CryptoUtil::EncryptAes256Cbc(key, iv, data);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22");
}